

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

void QCache<QString,_QRegularExpression>::Node::createInPlace
               (Node *n,QString *k,QRegularExpression *o,qsizetype cost)

{
  long in_FS_OFFSET;
  Value local_40;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (k->d).d;
  local_30.ptr = (k->d).ptr;
  local_30.size = (k->d).size;
  if (local_30.d != (Data *)0x0) {
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.t = o;
  local_40.cost = cost;
  Node(n,(QString *)&local_30,&local_40);
  Value::~Value(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void createInPlace(Node *n, const Key &k, T *o, qsizetype cost)
        {
            new (n) Node{ Key(k), Value(o, cost) };
        }